

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall
denialofservice_tests::outbound_slow_chain_eviction::test_method(outbound_slow_chain_eviction *this)

{
  PeerManager *pPVar1;
  pointer ppCVar2;
  int iVar3;
  Chainstate *pCVar4;
  int64_t iVar5;
  NetEventsInterface *pNVar6;
  iterator pvVar7;
  iterator pvVar8;
  long in_FS_OFFSET;
  readonly_property<bool> rVar9;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  shared_ptr<Sock> sock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock25;
  CNode dummyNode1;
  CAddress *pCVar10;
  undefined4 in_stack_fffffffffffff95c;
  CConnman *node_opts;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 local_4f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  unique_lock<std::mutex> local_4e0;
  assertion_result local_4d0;
  char **local_4b8;
  undefined1 local_4b0;
  unique_lock<std::mutex> local_4a8;
  undefined1 local_498 [16];
  shared_count asStack_488 [2];
  direct_or_indirect local_478;
  undefined1 *local_468;
  CAddress *pCStack_460;
  undefined8 local_450;
  undefined8 local_448;
  CNode local_440;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_4a8._M_device = &NetEventsInterface::g_msgproc_mutex.super_mutex;
  local_4a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_4a8);
  node_opts = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
              super_BasicTestingSetup.m_node.connman._M_t.
              super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
              super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
              super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  (node_opts->m_peer_connect_timeout).__r = 99999;
  pPVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.peerman._M_t.
           super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
           super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
           super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
  ip((CService *)&local_98.indirect_contents,0xa0b0c001);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  local_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  local_4f8 = (undefined1  [8])0x0;
  p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_478);
  local_450 = 100000000;
  local_448 = 0;
  local_498._0_8_ = asStack_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498);
  local_4d0._0_8_ = (ulong)(uint)local_4d0._4_4_ << 0x20;
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = local_4d0.m_message.pn.pi_ & 0xffffffffffffff00;
  local_4b8 = (char **)0x4c4b40;
  local_4b0 = 0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_4f8;
  pCVar10 = (CAddress *)local_498;
  CNode::CNode(&local_440,0,sock,(CAddress *)0x0,0,(uint64_t)&local_478,(CAddress *)local_498,
               (string *)CONCAT44(in_stack_fffffffffffff95c,1),INBOUND,SUB81(&local_4d0,0),
               (CNodeOptions *)node_opts);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_4d0.m_message);
  if ((shared_count *)local_498._0_8_ != asStack_488) {
    operator_delete((void *)local_498._0_8_,
                    (ulong)((long)&(asStack_488[0].pi_)->_vptr_sp_counted_base + 1));
  }
  if (0x10 < (uint)local_468._0_4_) {
    free(local_478.indirect_contents.indirect);
  }
  if (p_Stack_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f0);
  }
  pvVar7 = (iterator)0x9;
  pvVar8 = (iterator)0x11180;
  ConnmanTestMsg::Handshake
            ((ConnmanTestMsg *)node_opts,&local_440,true,NODE_WITNESS|NODE_NETWORK,
             NODE_WITNESS|NODE_NETWORK,0x11180,true);
  local_4e0._M_device = (mutex_type *)&cs_main;
  local_4e0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_4e0);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4e;
  file.m_begin = (iterator)&local_508;
  msg.m_end = pvVar8;
  msg.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_518,msg);
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    rVar9.super_class_property<bool>.value = (class_property<bool>)false;
  }
  else {
    rVar9.super_class_property<bool>.value =
         (class_property<bool>)(ppCVar2[-1] != (CBlockIndex *)0x0);
  }
  local_4d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar9.super_class_property<bool>.value;
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "m_node.chainman->ActiveChain().Tip() != nullptr";
  local_498._8_8_ = (long)"m_node.chainman->ActiveChain().Tip() != nullptr" + 0x2f;
  local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
  local_478.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_468 = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_520 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  pCStack_460 = (CAddress *)local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_4d0,(lazy_ostream *)&local_478,1,0,WARN,(check_type)pCVar10,(size_t)&local_528,
             0x4e);
  boost::detail::shared_count::~shared_count(&local_4d0.m_message.pn);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4f;
  file_00.m_begin = (iterator)&local_538;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_548,
             msg_00);
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  local_468 = (undefined1 *)0x0;
  pCStack_460 = (CAddress *)0x0;
  local_478.indirect_contents.indirect = (char *)0x0;
  local_478._8_8_ = 0;
  iVar3 = base_uint<256U>::CompareTo
                    (&((pCVar4->m_chain).vChain.
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>,
                     (base_uint<256U> *)&local_478);
  local_498[0] = 0 < iVar3;
  local_498._8_8_ = 0;
  asStack_488[0].pi_ = (sp_counted_base *)0x0;
  local_4b8 = &local_558;
  local_558 = "m_node.chainman->ActiveChain().Tip()->nChainWork > 0";
  local_550 = "";
  local_4d0.m_message.px = (element_type *)((ulong)local_4d0.m_message.px & 0xffffffffffffff00);
  local_4d0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_560 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_498,(lazy_ostream *)&local_4d0,1,0,WARN,(check_type)pCVar10,
             (size_t)&local_568,0x4f);
  boost::detail::shared_count::~shared_count(asStack_488);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_4e0);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x53;
  file_01.m_begin = (iterator)&local_578;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_588,
             msg_01);
  pNVar6 = &pPVar1->super_NetEventsInterface;
  iVar3 = (*(pPVar1->super_NetEventsInterface)._vptr_NetEventsInterface[4])(pNVar6,&local_440);
  local_4d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar3,0);
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "peerman.SendMessages(&dummyNode1)";
  local_498._8_8_ = (long)"peerman.SendMessages(&dummyNode1)" + 0x21;
  local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
  local_478.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_468 = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_590 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  pCStack_460 = (CAddress *)local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_4d0,(lazy_ostream *)&local_478,1,0,WARN,(check_type)pCVar10,(size_t)&local_598,
             0x53);
  boost::detail::shared_count::~shared_count(&local_4d0.m_message.pn);
  local_4e0._M_device = &local_440.cs_vSend.super_mutex;
  local_4e0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_4e0);
  (*(*(_func_int ***)
      local_440.m_transport._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
      _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
      super__Head_base<0UL,_Transport_*,_false>._M_head_impl)[7])
            (&local_478,
             local_440.m_transport._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl,0);
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000058;
  file_02.m_begin = (iterator)&local_5a8;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5b8,
             msg_02);
  local_498[0] = pCStack_460 != (CAddress *)0x0;
  local_498._8_8_ = 0;
  asStack_488[0].pi_ = (sp_counted_base *)0x0;
  local_558 = "!to_send.empty()";
  local_550 = "";
  local_4d0.m_message.px = (element_type *)((ulong)local_4d0.m_message.px & 0xffffffffffffff00);
  local_4d0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_558;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5c0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_498,(lazy_ostream *)&local_4d0,1,0,WARN,(check_type)pCVar10,
             (size_t)&local_5c8,0x58);
  boost::detail::shared_count::~shared_count(asStack_488);
  std::unique_lock<std::mutex>::~unique_lock(&local_4e0);
  ConnmanTestMsg::FlushSendBuffer((ConnmanTestMsg *)node_opts,&local_440);
  iVar5 = GetTime();
  SetMockTime(iVar5 + 0x4ec);
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5f;
  file_03.m_begin = (iterator)&local_5d8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5e8,
             msg_03);
  iVar3 = (*pNVar6->_vptr_NetEventsInterface[4])(pNVar6,&local_440);
  local_4d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar3,0);
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "peerman.SendMessages(&dummyNode1)";
  local_498._8_8_ = (long)"peerman.SendMessages(&dummyNode1)" + 0x21;
  local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
  local_478.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_468 = boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5f0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  pCStack_460 = (CAddress *)local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_4d0,(lazy_ostream *)&local_478,1,0,WARN,(check_type)pCVar10,(size_t)&local_5f8,
             0x5f);
  boost::detail::shared_count::~shared_count(&local_4d0.m_message.pn);
  local_4e0._M_device = &local_440.cs_vSend.super_mutex;
  local_4e0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_4e0);
  (*(*(_func_int ***)
      local_440.m_transport._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
      _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
      super__Head_base<0UL,_Transport_*,_false>._M_head_impl)[7])
            (&local_478,
             local_440.m_transport._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl,0);
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x63;
  file_04.m_begin = (iterator)&local_608;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_618,
             msg_04);
  local_498[0] = pCStack_460 != (CAddress *)0x0;
  local_498._8_8_ = 0;
  asStack_488[0].pi_ = (sp_counted_base *)0x0;
  local_558 = "!to_send.empty()";
  local_550 = "";
  local_4d0.m_message.px = (element_type *)((ulong)local_4d0.m_message.px & 0xffffffffffffff00);
  local_4d0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_558;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_620 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_498,(lazy_ostream *)&local_4d0,1,0,WARN,(check_type)pCVar10,
             (size_t)&local_628,99);
  boost::detail::shared_count::~shared_count(asStack_488);
  std::unique_lock<std::mutex>::~unique_lock(&local_4e0);
  SetMockTime(iVar5 + 0x5a0);
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x67;
  file_05.m_begin = (iterator)&local_638;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_648,
             msg_05);
  iVar3 = (*pNVar6->_vptr_NetEventsInterface[4])(pNVar6,&local_440);
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "peerman.SendMessages(&dummyNode1)";
  local_498._8_8_ = (long)"peerman.SendMessages(&dummyNode1)" + 0x21;
  local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
  local_478.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_468 = boost::unit_test::lazy_ostream::inst;
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_650 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  pCStack_460 = (CAddress *)local_498;
  local_4d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar3,0);
  boost::test_tools::tt_detail::report_assertion
            (&local_4d0,(lazy_ostream *)&local_478,1,0,WARN,(check_type)pCVar10,(size_t)&local_658,
             0x67);
  boost::detail::shared_count::~shared_count(&local_4d0.m_message.pn);
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = &DAT_00000068;
  file_06.m_begin = (iterator)&local_668;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_678,
             msg_06);
  local_4d0._0_8_ =
       CONCAT71(local_4d0._1_7_,local_440.fDisconnect._M_base._M_i) & 0xffffffffffffff01;
  local_4d0.m_message.px = (element_type *)0x0;
  local_4d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "dummyNode1.fDisconnect == true";
  local_498._8_8_ = (long)"dummyNode1.fDisconnect == true" + 0x1e;
  local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
  local_478.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_468 = boost::unit_test::lazy_ostream::inst;
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_680 = "";
  pCStack_460 = (CAddress *)local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_4d0,(lazy_ostream *)&local_478,1,0,WARN,(check_type)pCVar10,(size_t)&local_688,
             0x68);
  boost::detail::shared_count::~shared_count(&local_4d0.m_message.pn);
  (*pNVar6->_vptr_NetEventsInterface[1])(pNVar6,&local_440);
  CNode::~CNode(&local_440);
  if (0x10 < local_60) {
    free(local_70.indirect_contents.indirect);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_4a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(outbound_slow_chain_eviction)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    ConnmanTestMsg& connman = static_cast<ConnmanTestMsg&>(*m_node.connman);
    // Disable inactivity checks for this test to avoid interference
    connman.SetPeerConnectTimeout(99999s);
    PeerManager& peerman = *m_node.peerman;

    // Mock an outbound peer
    CAddress addr1(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode1{id++,
                     /*sock=*/nullptr,
                     addr1,
                     /*nKeyedNetGroupIn=*/0,
                     /*nLocalHostNonceIn=*/0,
                     CAddress(),
                     /*addrNameIn=*/"",
                     ConnectionType::OUTBOUND_FULL_RELAY,
                     /*inbound_onion=*/false};

    connman.Handshake(
        /*node=*/dummyNode1,
        /*successfully_connected=*/true,
        /*remote_services=*/ServiceFlags(NODE_NETWORK | NODE_WITNESS),
        /*local_services=*/ServiceFlags(NODE_NETWORK | NODE_WITNESS),
        /*version=*/PROTOCOL_VERSION,
        /*relay_txs=*/true);

    // This test requires that we have a chain with non-zero work.
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip() != nullptr);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->nChainWork > 0);
    }

    // Test starts here
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in getheaders

    {
        LOCK(dummyNode1.cs_vSend);
        const auto& [to_send, _more, _msg_type] = dummyNode1.m_transport->GetBytesToSend(false);
        BOOST_CHECK(!to_send.empty());
    }
    connman.FlushSendBuffer(dummyNode1);

    int64_t nStartTime = GetTime();
    // Wait 21 minutes
    SetMockTime(nStartTime+21*60);
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in getheaders
    {
        LOCK(dummyNode1.cs_vSend);
        const auto& [to_send, _more, _msg_type] = dummyNode1.m_transport->GetBytesToSend(false);
        BOOST_CHECK(!to_send.empty());
    }
    // Wait 3 more minutes
    SetMockTime(nStartTime+24*60);
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in disconnect
    BOOST_CHECK(dummyNode1.fDisconnect == true);

    peerman.FinalizeNode(dummyNode1);
}